

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void save(LexState *ls,int c)

{
  long lVar1;
  size_t osize;
  void *pvVar2;
  undefined4 in_ESI;
  long in_RDI;
  size_t newsize;
  Mbuffer *b;
  int in_stack_00000034;
  char *in_stack_00000038;
  LexState *in_stack_00000040;
  size_t in_stack_ffffffffffffffd8;
  long *block;
  undefined4 in_stack_fffffffffffffff0;
  
  block = *(long **)(in_RDI + 0x48);
  if ((ulong)block[2] < block[1] + 1U) {
    if (0x7ffffffffffffffd < (ulong)block[2]) {
      luaX_lexerror(in_stack_00000040,in_stack_00000038,in_stack_00000034);
    }
    osize = block[2] * 2;
    if (osize + 1 < 0xfffffffffffffffe) {
      pvVar2 = luaM_realloc_((lua_State *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),block,osize,
                             in_stack_ffffffffffffffd8);
    }
    else {
      pvVar2 = luaM_toobig((lua_State *)0x113faf);
    }
    *block = (long)pvVar2;
    block[2] = osize;
  }
  lVar1 = block[1];
  block[1] = lVar1 + 1;
  *(char *)(*block + lVar1) = (char)in_ESI;
  return;
}

Assistant:

static void save(LexState*ls,int c){
Mbuffer*b=ls->buff;
if(b->n+1>b->buffsize){
size_t newsize;
if(b->buffsize>=((size_t)(~(size_t)0)-2)/2)
luaX_lexerror(ls,"lexical element too long",0);
newsize=b->buffsize*2;
luaZ_resizebuffer(ls->L,b,newsize);
}
b->buffer[b->n++]=cast(char,c);
}